

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O3

int Gia_ManLevelWithBoxes(Gia_Man_t *p)

{
  Tim_Man_t *p_00;
  Vec_Int_t *pVVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  float *pfVar8;
  Gia_Obj_t *pGVar9;
  int Fill;
  uint Fill_00;
  float *pfVar10;
  float *pfVar11;
  Gia_Obj_t *pGVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  float fVar17;
  int local_a4;
  int local_94;
  int local_90;
  
  iVar3 = p->nAnd2Delay + (uint)(p->nAnd2Delay == 0);
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                  ,0x1e3,"int Gia_ManLevelWithBoxes(Gia_Man_t *)");
  }
  if (p->nBufs != 0) {
    __assert_fail("Gia_ManBufNum(p) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                  ,0x1e4,"int Gia_ManLevelWithBoxes(Gia_Man_t *)");
  }
  p_00 = (Tim_Man_t *)p->pManTime;
  Gia_ManCleanLevels(p,p->nObjs);
  if (0 < p->nObjs) {
    pVVar1 = p->vLevels;
    Vec_IntFillExtra(pVVar1,1,Fill);
    if (pVVar1->nSize < 1) {
LAB_00783f35:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    *pVVar1->pArray = 0;
    Gia_ManIncrementTravId(p);
    if (0 < p->nObjs) {
      if (p->nTravIdsAlloc < 1) {
LAB_00783f54:
        __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x23a,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
      }
      *p->pTravIds = p->nTravIds;
      iVar4 = Tim_ManPiNum(p_00);
      if (0 < iVar4) {
        lVar16 = 0;
        do {
          if (p->vCis->nSize <= lVar16) goto LAB_00783ed8;
          iVar4 = p->vCis->pArray[lVar16];
          if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_00783ef7;
          pGVar12 = p->pObjs + iVar4;
          fVar17 = Tim_ManGetCiArrival(p_00,(int)lVar16);
          pGVar9 = p->pObjs;
          if ((pGVar12 < pGVar9) || (pGVar9 + p->nObjs <= pGVar12)) goto LAB_00783f16;
          uVar5 = (int)((long)pGVar12 - (long)pGVar9 >> 2) * -0x55555555;
          pVVar1 = p->vLevels;
          Vec_IntFillExtra(pVVar1,uVar5 + 1,(int)p);
          if (((int)uVar5 < 0) || (pVVar1->nSize <= (int)uVar5)) goto LAB_00783f35;
          pVVar1->pArray[uVar5 & 0x7fffffff] = (int)(fVar17 / (float)iVar3);
          pGVar9 = p->pObjs;
          if ((pGVar12 < pGVar9) || (pGVar9 + p->nObjs <= pGVar12)) goto LAB_00783f16;
          iVar4 = (int)((long)pGVar12 - (long)pGVar9 >> 2) * -0x55555555;
          if (p->nTravIdsAlloc <= iVar4) goto LAB_00783f54;
          p->pTravIds[iVar4] = p->nTravIds;
          lVar16 = lVar16 + 1;
          iVar4 = Tim_ManPiNum(p_00);
        } while (lVar16 < iVar4);
      }
      local_90 = Tim_ManPiNum(p_00);
      iVar4 = Tim_ManBoxNum(p_00);
      if (iVar4 < 1) {
        local_a4 = 0;
      }
      else {
        iVar4 = 0;
        local_a4 = 0;
        do {
          uVar5 = Tim_ManBoxInputNum(p_00,iVar4);
          uVar6 = Tim_ManBoxOutputNum(p_00,iVar4);
          pfVar8 = Tim_ManBoxDelayTable(p_00,iVar4);
          uVar15 = (ulong)uVar5;
          if (0 < (int)uVar5) {
            lVar16 = (long)local_a4;
            uVar14 = uVar15;
            do {
              if ((local_a4 < 0) || (p->vCos->nSize <= lVar16)) goto LAB_00783ed8;
              iVar7 = p->vCos->pArray[lVar16];
              if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_00783ef7;
              pGVar9 = p->pObjs + iVar7;
              iVar7 = Gia_ManLevelWithBoxes_rec
                                (p,pGVar9 + -(ulong)((uint)*(undefined8 *)pGVar9 & 0x1fffffff));
              if (iVar7 != 0) {
                puts(
                    "Boxes are not in a topological order. Switching to level computation without boxes."
                    );
                iVar3 = Gia_ManLevelNum(p);
                return iVar3;
              }
              Gia_ObjSetCoLevel(p,pGVar9);
              lVar16 = lVar16 + 1;
              uVar14 = uVar14 - 1;
            } while (uVar14 != 0);
          }
          if (0 < (int)uVar6) {
            pfVar10 = pfVar8 + 3;
            uVar14 = 0;
            do {
              if (local_90 < 0) goto LAB_00783ed8;
              if ((long)p->vCis->nSize <= (long)((long)local_90 + uVar14)) goto LAB_00783ed8;
              iVar7 = p->vCis->pArray[(long)local_90 + uVar14];
              lVar16 = (long)iVar7;
              if ((lVar16 < 0) || (p->nObjs <= iVar7)) goto LAB_00783ef7;
              if (p->nTravIdsAlloc <= iVar7) goto LAB_00783f54;
              pGVar9 = p->pObjs;
              p->pTravIds[lVar16] = p->nTravIds;
              Fill_00 = (uint)pfVar8[1];
              if (uVar5 != Fill_00) {
                __assert_fail("nBoxInputs == (int)pDelayTable[1]",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                              ,0x20b,"int Gia_ManLevelWithBoxes(Gia_Man_t *)");
              }
              pGVar12 = pGVar9 + lVar16;
              if ((int)uVar5 < 1) {
                local_94 = 0;
              }
              else {
                local_94 = 0;
                pfVar11 = pfVar10;
                lVar16 = (long)local_a4;
                uVar13 = uVar15;
                do {
                  if ((local_a4 < 0) || (p->vCos->nSize <= lVar16)) goto LAB_00783ed8;
                  iVar7 = p->vCos->pArray[lVar16];
                  if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_00783ef7;
                  if (p->pObjs == (Gia_Obj_t *)0x0) {
                    pGVar9 = (Gia_Obj_t *)0x0;
                    goto LAB_00783c8f;
                  }
                  if ((int)*pfVar11 != -1000000000) {
                    pVVar1 = p->vLevels;
                    Vec_IntFillExtra(pVVar1,iVar7 + 1,Fill_00);
                    if (pVVar1->nSize <= iVar7) goto LAB_00783ed8;
                    Fill_00 = (int)*pfVar11 % iVar3;
                    iVar7 = (int)*pfVar11 / iVar3 + pVVar1->pArray[iVar7];
                    if (local_94 <= iVar7) {
                      local_94 = iVar7;
                    }
                  }
                  pfVar11 = pfVar11 + 1;
                  lVar16 = lVar16 + 1;
                  uVar13 = uVar13 - 1;
                } while (uVar13 != 0);
                pGVar9 = p->pObjs;
              }
              if (pGVar12 < pGVar9) goto LAB_00783f16;
LAB_00783c8f:
              if (pGVar9 + p->nObjs <= pGVar12) goto LAB_00783f16;
              uVar2 = (int)((long)pGVar12 - (long)pGVar9 >> 2) * -0x55555555;
              pVVar1 = p->vLevels;
              Vec_IntFillExtra(pVVar1,uVar2 + 1,Fill_00);
              if (((int)uVar2 < 0) || (pVVar1->nSize <= (int)uVar2)) goto LAB_00783f35;
              pVVar1->pArray[uVar2 & 0x7fffffff] = local_94;
              uVar14 = uVar14 + 1;
              pfVar10 = pfVar10 + uVar15;
            } while (uVar14 != uVar6);
          }
          local_90 = local_90 + uVar6;
          local_a4 = local_a4 + uVar5;
          iVar4 = iVar4 + 1;
          iVar7 = Tim_ManBoxNum(p_00);
        } while (iVar4 < iVar7);
      }
      p->nLevels = 0;
      iVar3 = Tim_ManCoNum(p_00);
      iVar4 = Tim_ManPoNum(p_00);
      uVar5 = iVar3 - iVar4;
      iVar3 = Tim_ManCoNum(p_00);
      if ((int)uVar5 < iVar3) {
        uVar15 = (ulong)uVar5;
LAB_00783d98:
        if (((int)uVar5 < 0) || (p->vCos->nSize <= (int)uVar15)) {
LAB_00783ed8:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar3 = p->vCos->pArray[uVar15];
        if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) {
LAB_00783ef7:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar9 = p->pObjs + iVar3;
        Gia_ManLevelWithBoxes_rec(p,pGVar9 + -(ulong)((uint)*(undefined8 *)pGVar9 & 0x1fffffff));
        Gia_ObjSetCoLevel(p,pGVar9);
        pGVar12 = p->pObjs;
        if ((pGVar9 < pGVar12) || (pGVar12 + p->nObjs <= pGVar9)) goto LAB_00783f16;
        iVar3 = p->nLevels;
        uVar6 = (int)((long)pGVar9 - (long)pGVar12 >> 2) * -0x55555555;
        pVVar1 = p->vLevels;
        Vec_IntFillExtra(pVVar1,uVar6 + 1,(int)p);
        if (((int)uVar6 < 0) || (pVVar1->nSize <= (int)uVar6)) goto LAB_00783ed8;
        iVar4 = pVVar1->pArray[uVar6 & 0x7fffffff];
        if (pVVar1->pArray[uVar6 & 0x7fffffff] < iVar3) {
          iVar4 = iVar3;
        }
        p->nLevels = iVar4;
        uVar15 = uVar15 + 1;
        iVar3 = Tim_ManCoNum(p_00);
        if ((int)uVar15 < iVar3) goto LAB_00783d98;
      }
      iVar3 = Tim_ManPoNum(p_00);
      if (local_90 != p->vCis->nSize) {
        __assert_fail("curCi == Gia_ManCiNum(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                      ,0x220,"int Gia_ManLevelWithBoxes(Gia_Man_t *)");
      }
      if (iVar3 + local_a4 != p->vCos->nSize) {
        __assert_fail("curCo == Gia_ManCoNum(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                      ,0x221,"int Gia_ManLevelWithBoxes(Gia_Man_t *)");
      }
      return p->nLevels;
    }
  }
LAB_00783f16:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Gia_ManLevelWithBoxes( Gia_Man_t * p )
{
    int nAnd2Delay = p->nAnd2Delay ? p->nAnd2Delay : 1;
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Gia_Obj_t * pObj, * pObjIn;
    int i, k, j, curCi, curCo, LevelMax;
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManBufNum(p) == 0 );
    // copy const and real PIs
    Gia_ManCleanLevels( p, Gia_ManObjNum(p) );
    Gia_ObjSetLevel( p, Gia_ManConst0(p), 0 );
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    for ( i = 0; i < Tim_ManPiNum(pManTime); i++ )
    {
        pObj = Gia_ManCi( p, i );
        Gia_ObjSetLevel( p, pObj, Tim_ManGetCiArrival(pManTime, i) / nAnd2Delay );
        Gia_ObjSetTravIdCurrent( p, pObj );
    }
    // create logic for each box
    curCi = Tim_ManPiNum(pManTime);
    curCo = 0;
    for ( i = 0; i < Tim_ManBoxNum(pManTime); i++ )
    {
        int nBoxInputs  = Tim_ManBoxInputNum( pManTime, i );
        int nBoxOutputs = Tim_ManBoxOutputNum( pManTime, i );
        float * pDelayTable = Tim_ManBoxDelayTable( pManTime, i );
        // compute level for TFI of box inputs
        for ( k = 0; k < nBoxInputs; k++ )
        {
            pObj = Gia_ManCo( p, curCo + k );
            if ( Gia_ManLevelWithBoxes_rec( p, Gia_ObjFanin0(pObj) ) )
            {
                printf( "Boxes are not in a topological order. Switching to level computation without boxes.\n" );
                return Gia_ManLevelNum( p );
            }
            // set box input level
            Gia_ObjSetCoLevel( p, pObj );
        }
        // compute level for box outputs
        for ( k = 0; k < nBoxOutputs; k++ )
        {
            pObj = Gia_ManCi( p, curCi + k );
            Gia_ObjSetTravIdCurrent( p, pObj );
            // evaluate delay of this output
            LevelMax = 0;
            assert( nBoxInputs == (int)pDelayTable[1] );
            for ( j = 0; j < nBoxInputs && (pObjIn = Gia_ManCo(p, curCo + j)); j++ )
                if ( (int)pDelayTable[3+k*nBoxInputs+j] != -ABC_INFINITY )
                    LevelMax = Abc_MaxInt( LevelMax, Gia_ObjLevel(p, pObjIn) + ((int)pDelayTable[3+k*nBoxInputs+j] / nAnd2Delay) );
            // set box output level
            Gia_ObjSetLevel( p, pObj, LevelMax );
        }
        curCo += nBoxInputs;
        curCi += nBoxOutputs;
    }
    // add remaining nodes
    p->nLevels = 0;
    for ( i = Tim_ManCoNum(pManTime) - Tim_ManPoNum(pManTime); i < Tim_ManCoNum(pManTime); i++ )
    {
        pObj = Gia_ManCo( p, i );
        Gia_ManLevelWithBoxes_rec( p, Gia_ObjFanin0(pObj) );
        Gia_ObjSetCoLevel( p, pObj );
        p->nLevels = Abc_MaxInt( p->nLevels, Gia_ObjLevel(p, pObj) );
    }
    curCo += Tim_ManPoNum(pManTime);
    // verify counts
    assert( curCi == Gia_ManCiNum(p) );
    assert( curCo == Gia_ManCoNum(p) );
//    printf( "Max level is %d.\n", p->nLevels );
    return p->nLevels;
}